

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_SendEventToOutputAsync
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,IOTHUB_MESSAGE_HANDLE eventMessageHandle,
          char *outputName,IOTHUB_CLIENT_EVENT_CONFIRMATION_CALLBACK eventConfirmationCallback,
          void *userContextCallback)

{
  IOTHUB_MESSAGE_RESULT IVar1;
  IOTHUB_CLIENT_RESULT IVar2;
  LOGGER_LOG p_Var3;
  
  if ((((eventMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) ||
       (iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0)) || (outputName == (char *)0x0)) ||
     (userContextCallback != (void *)0x0 &&
      eventConfirmationCallback == (IOTHUB_CLIENT_EVENT_CONFIRMATION_CALLBACK)0x0)) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      IVar2 = IOTHUB_CLIENT_INVALID_ARG;
    }
    else {
      IVar2 = IOTHUB_CLIENT_INVALID_ARG;
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_SendEventToOutputAsync",0xc10,1,
                "Invalid argument (iotHubClientHandle=%p, outputName=%p, eventMessageHandle=%p)",
                iotHubClientHandle,outputName,eventMessageHandle);
    }
  }
  else {
    IVar1 = IoTHubMessage_SetOutputName(eventMessageHandle,outputName);
    if (IVar1 == IOTHUB_MESSAGE_OK) {
      IVar2 = IoTHubClientCore_LL_SendEventAsync
                        (iotHubClientHandle,eventMessageHandle,eventConfirmationCallback,
                         userContextCallback);
      if (IVar2 == IOTHUB_CLIENT_OK) {
        IVar2 = IOTHUB_CLIENT_OK;
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_SendEventToOutputAsync",0xc1c,1,
                    "Call into IoTHubClient_LL_SendEventAsync failed, result=%d",(ulong)IVar2);
        }
      }
    }
    else {
      p_Var3 = xlogging_get_log_function();
      IVar2 = IOTHUB_CLIENT_ERROR;
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_SendEventToOutputAsync",0xc17,1,
                  "IoTHubMessage_SetOutputName failed");
      }
    }
  }
  return IVar2;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_SendEventToOutputAsync(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, IOTHUB_MESSAGE_HANDLE eventMessageHandle, const char* outputName, IOTHUB_CLIENT_EVENT_CONFIRMATION_CALLBACK eventConfirmationCallback, void* userContextCallback)
{
    IOTHUB_CLIENT_RESULT result;

    if ((iotHubClientHandle == NULL) || (outputName == NULL) || (eventMessageHandle == NULL) || ((eventConfirmationCallback == NULL) && (userContextCallback != NULL)))
    {
        LogError("Invalid argument (iotHubClientHandle=%p, outputName=%p, eventMessageHandle=%p)", iotHubClientHandle, outputName, eventMessageHandle);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        if (IoTHubMessage_SetOutputName(eventMessageHandle, outputName) != IOTHUB_MESSAGE_OK)
        {
            LogError("IoTHubMessage_SetOutputName failed");
            result = IOTHUB_CLIENT_ERROR;
        }
        else if ((result = IoTHubClientCore_LL_SendEventAsync(iotHubClientHandle, eventMessageHandle, eventConfirmationCallback, userContextCallback)) != IOTHUB_CLIENT_OK)
        {
            LogError("Call into IoTHubClient_LL_SendEventAsync failed, result=%d", result);
        }
    }

    return result;
}